

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# laswriteitemcompressed_v1.cpp
# Opt level: O0

void __thiscall
LASwriteItemCompressed_POINT10_v1::~LASwriteItemCompressed_POINT10_v1
          (LASwriteItemCompressed_POINT10_v1 *this)

{
  IntegerCompressor *pIVar1;
  uint local_14;
  U32 i;
  LASwriteItemCompressed_POINT10_v1 *this_local;
  
  (this->super_LASwriteItemCompressed).super_LASwriteItem._vptr_LASwriteItem =
       (_func_int **)&PTR_write_001b0ab8;
  pIVar1 = this->ic_dx;
  if (pIVar1 != (IntegerCompressor *)0x0) {
    IntegerCompressor::~IntegerCompressor(pIVar1);
    operator_delete(pIVar1);
  }
  pIVar1 = this->ic_dy;
  if (pIVar1 != (IntegerCompressor *)0x0) {
    IntegerCompressor::~IntegerCompressor(pIVar1);
    operator_delete(pIVar1);
  }
  pIVar1 = this->ic_z;
  if (pIVar1 != (IntegerCompressor *)0x0) {
    IntegerCompressor::~IntegerCompressor(pIVar1);
    operator_delete(pIVar1);
  }
  pIVar1 = this->ic_intensity;
  if (pIVar1 != (IntegerCompressor *)0x0) {
    IntegerCompressor::~IntegerCompressor(pIVar1);
    operator_delete(pIVar1);
  }
  pIVar1 = this->ic_scan_angle_rank;
  if (pIVar1 != (IntegerCompressor *)0x0) {
    IntegerCompressor::~IntegerCompressor(pIVar1);
    operator_delete(pIVar1);
  }
  pIVar1 = this->ic_point_source_ID;
  if (pIVar1 != (IntegerCompressor *)0x0) {
    IntegerCompressor::~IntegerCompressor(pIVar1);
    operator_delete(pIVar1);
  }
  ArithmeticEncoder::destroySymbolModel(this->enc,this->m_changed_values);
  for (local_14 = 0; local_14 < 0x100; local_14 = local_14 + 1) {
    if (this->m_bit_byte[local_14] != (ArithmeticModel *)0x0) {
      ArithmeticEncoder::destroySymbolModel(this->enc,this->m_bit_byte[local_14]);
    }
    if (this->m_classification[local_14] != (ArithmeticModel *)0x0) {
      ArithmeticEncoder::destroySymbolModel(this->enc,this->m_classification[local_14]);
    }
    if (this->m_user_data[local_14] != (ArithmeticModel *)0x0) {
      ArithmeticEncoder::destroySymbolModel(this->enc,this->m_user_data[local_14]);
    }
  }
  LASwriteItemCompressed::~LASwriteItemCompressed(&this->super_LASwriteItemCompressed);
  return;
}

Assistant:

LASwriteItemCompressed_POINT10_v1::~LASwriteItemCompressed_POINT10_v1()
{
  U32 i;
  delete ic_dx;
  delete ic_dy;
  delete ic_z;
  delete ic_intensity;
  delete ic_scan_angle_rank;
  delete ic_point_source_ID;
  enc->destroySymbolModel(m_changed_values);
  for (i = 0; i < 256; i++)
  {
    if (m_bit_byte[i]) enc->destroySymbolModel(m_bit_byte[i]);
    if (m_classification[i]) enc->destroySymbolModel(m_classification[i]);
    if (m_user_data[i]) enc->destroySymbolModel(m_user_data[i]);
  }
}